

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmres.h
# Opt level: O3

int GMRES<TPZMatrix<double>,TPZFMatrix<double>,TPZMatrixSolver<double>,TPZFMatrix<double>,double>
              (TPZMatrix<double> *A,TPZFMatrix<double> *x,TPZFMatrix<double> *b,
              TPZMatrixSolver<double> *M,TPZFMatrix<double> *H,int *m,int64_t *max_iter,double *tol,
              TPZFMatrix<double> *residual,int FromCurrent)

{
  long lVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double *pdVar5;
  double *pdVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  int iVar9;
  ulong *puVar10;
  TPZFMatrix<double> *v;
  TPZFMatrix<double> *pTVar11;
  ostream *poVar12;
  long lVar13;
  TPZFMatrix<double> *pTVar14;
  ulong uVar15;
  ulong *puVar16;
  long lVar17;
  TPZFMatrix<double> *A_00;
  long lVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  double dVar22;
  double dVar23;
  TPZFMatrix<double> w;
  TPZFMatrix<double> s;
  TPZFMatrix<double> w1;
  TPZFMatrix<double> resbackup;
  double local_420;
  double local_3f8;
  long local_3b8;
  TPZFMatrix<double> local_390;
  TPZFMatrix<double> local_300;
  TPZFMatrix<double> local_270;
  TPZFMatrix<double> local_1e0;
  TPZFMatrix<double> local_150;
  TPZFMatrix<double> local_c0;
  
  iVar9 = *m;
  lVar20 = (long)iVar9 + 1;
  local_300.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
  local_300.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_300.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_300.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018151d8;
  local_300.fElem = (double *)0x0;
  local_300.fGiven = (double *)0x0;
  local_300.fSize = 0;
  local_300.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar20;
  TPZVec<int>::TPZVec(&local_300.fPivot.super_TPZVec<int>,0);
  local_300.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_300.fPivot.super_TPZVec<int>.fStore = local_300.fPivot.fExtAlloc;
  local_300.fPivot.super_TPZVec<int>.fNElements = 0;
  local_300.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_300.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_300.fWork.fStore = (double *)0x0;
  local_300.fWork.fNElements = 0;
  local_300.fWork.fNAlloc = 0;
  if ((int)lVar20 != 0) {
    uVar15 = 0xffffffffffffffff;
    if (-2 < iVar9) {
      uVar15 = lVar20 * 8;
    }
    local_300.fElem = (double *)operator_new__(uVar15);
  }
  iVar9 = *m;
  lVar20 = (long)iVar9 + 1;
  local_1e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
  local_1e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_1e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_1e0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018151d8;
  local_1e0.fElem = (double *)0x0;
  local_1e0.fGiven = (double *)0x0;
  local_1e0.fSize = 0;
  local_1e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar20;
  TPZVec<int>::TPZVec(&local_1e0.fPivot.super_TPZVec<int>,0);
  local_1e0.fPivot.super_TPZVec<int>.fStore = local_1e0.fPivot.fExtAlloc;
  local_1e0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_1e0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_1e0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_1e0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_1e0.fWork.fStore = (double *)0x0;
  local_1e0.fWork.fNElements = 0;
  local_1e0.fWork.fNAlloc = 0;
  if ((int)lVar20 != 0) {
    uVar15 = 0xffffffffffffffff;
    if (-2 < iVar9) {
      uVar15 = lVar20 * 8;
    }
    local_1e0.fElem = (double *)operator_new__(uVar15);
  }
  iVar9 = *m;
  lVar20 = (long)iVar9 + 1;
  local_270.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
  local_270.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_270.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_270.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018151d8;
  local_270.fElem = (double *)0x0;
  local_270.fGiven = (double *)0x0;
  local_270.fSize = 0;
  local_270.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar20;
  TPZVec<int>::TPZVec(&local_270.fPivot.super_TPZVec<int>,0);
  local_270.fPivot.super_TPZVec<int>.fStore = local_270.fPivot.fExtAlloc;
  local_270.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_270.fPivot.super_TPZVec<int>.fNElements = 0;
  local_270.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_270.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_270.fWork.fStore = (double *)0x0;
  local_270.fWork.fNElements = 0;
  local_270.fWork.fNAlloc = 0;
  if ((int)lVar20 != 0) {
    uVar15 = 0xffffffffffffffff;
    if (-2 < iVar9) {
      uVar15 = lVar20 * 8;
    }
    local_270.fElem = (double *)operator_new__(uVar15);
  }
  local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
  local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
  local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018151d8;
  local_150.fElem = (double *)0x0;
  local_150.fGiven = (double *)0x0;
  local_150.fSize = 0;
  TPZVec<int>::TPZVec(&local_150.fPivot.super_TPZVec<int>,0);
  local_150.fPivot.super_TPZVec<int>.fStore = local_150.fPivot.fExtAlloc;
  local_150.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_150.fPivot.super_TPZVec<int>.fNElements = 0;
  local_150.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_150.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_150.fWork.fStore = (double *)0x0;
  local_150.fWork.fNElements = 0;
  local_150.fWork.fNAlloc = 0;
  local_390.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
  local_390.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
  local_390.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_390.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_390.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018151d8;
  local_390.fElem = (double *)0x0;
  local_390.fGiven = (double *)0x0;
  local_390.fSize = 0;
  TPZVec<int>::TPZVec(&local_390.fPivot.super_TPZVec<int>,0);
  local_390.fPivot.super_TPZVec<int>.fStore = local_390.fPivot.fExtAlloc;
  local_390.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_390.fPivot.super_TPZVec<int>.fNElements = 0;
  local_390.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_390.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_390.fWork.fStore = (double *)0x0;
  local_390.fWork.fNElements = 0;
  local_390.fWork.fNAlloc = 0;
  local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
  local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
  local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018151d8;
  local_c0.fElem = (double *)0x0;
  local_c0.fGiven = (double *)0x0;
  local_c0.fSize = 0;
  TPZVec<int>::TPZVec(&local_c0.fPivot.super_TPZVec<int>,0);
  local_c0.fPivot.super_TPZVec<int>.fStore = local_c0.fPivot.fExtAlloc;
  local_c0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_c0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_c0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_c0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_c0.fWork.fStore = (double *)0x0;
  local_c0.fWork.fNElements = 0;
  local_c0.fWork.fNAlloc = 0;
  A_00 = residual;
  if (residual == (TPZFMatrix<double> *)0x0) {
    A_00 = &local_c0;
  }
  (*(M->super_TPZSolver).super_TPZSavable._vptr_TPZSavable[0xb])(M,b,A_00,0);
  dVar22 = Dot<double>(A_00,A_00);
  if (dVar22 < 0.0) {
    dVar22 = sqrt(dVar22);
  }
  else {
    dVar22 = SQRT(dVar22);
  }
  if (FromCurrent == 0) {
    (*(x->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xf])();
    TPZFMatrix<double>::operator=(A_00,b);
  }
  else {
    (*(A->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x27])
              (0xbff0000000000000,A,x,b,A_00,0);
  }
  (*(M->super_TPZSolver).super_TPZSavable._vptr_TPZSavable[0xb])(M,A_00,&local_390,0);
  TPZFMatrix<double>::operator=(A_00,&local_390);
  local_420 = Dot<double>(A_00,A_00);
  if (local_420 < 0.0) {
    local_420 = sqrt(local_420);
  }
  else {
    local_420 = SQRT(local_420);
  }
  local_3f8 = Dot<double>(A_00,A_00);
  dVar22 = (double)(~-(ulong)(dVar22 == 0.0) & (ulong)dVar22 |
                   -(ulong)(dVar22 == 0.0) & 0x3ff0000000000000);
  if (local_3f8 < 0.0) {
    local_3f8 = sqrt(local_3f8);
  }
  else {
    local_3f8 = SQRT(local_3f8);
  }
  local_3f8 = local_3f8 / dVar22;
  if (*tol < local_3f8) {
    iVar9 = *m;
    uVar19 = (ulong)(iVar9 + 1);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar19;
    uVar15 = 0xffffffffffffffff;
    if (SUB168(auVar8 * ZEXT816(0x90),8) == 0) {
      uVar15 = SUB168(auVar8 * ZEXT816(0x90),0) | 8;
    }
    puVar10 = (ulong *)operator_new__(uVar15);
    *puVar10 = uVar19;
    if (iVar9 + 1 != 0) {
      lVar20 = 0;
      puVar16 = puVar10;
      do {
        puVar16[2] = 0;
        puVar16[3] = 0;
        *(undefined2 *)(puVar16 + 4) = 0;
        puVar16[1] = (ulong)&PTR__TPZFMatrix_018151d8;
        puVar16[5] = 0;
        puVar16[6] = 0;
        puVar16[7] = 0;
        TPZVec<int>::TPZVec((TPZVec<int> *)(puVar16 + 8),0);
        puVar16[8] = (ulong)&PTR__TPZManVector_01815498;
        puVar16[9] = (ulong)(puVar16 + 0xc);
        puVar16[10] = 0;
        puVar16[0xb] = 0;
        puVar16[0xf] = (ulong)&PTR__TPZVec_01813df0;
        puVar16[0x10] = 0;
        puVar16[0x11] = 0;
        puVar16[0x12] = 0;
        lVar20 = lVar20 + -0x90;
        puVar16 = puVar16 + 0x12;
      } while (-lVar20 != uVar19 * 0x90);
    }
    if (0 < *max_iter) {
      v = (TPZFMatrix<double> *)(puVar10 + 1);
      pTVar11 = &local_c0;
      if (residual != (TPZFMatrix<double> *)0x0) {
        pTVar11 = residual;
      }
      lVar20 = 1;
      do {
        lVar18 = (pTVar11->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
        (*(v->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xd])
                  (v,lVar18,1);
        pdVar6 = local_300.fElem;
        if (0 < lVar18) {
          pdVar5 = pTVar11->fElem;
          uVar15 = puVar10[5];
          lVar13 = 0;
          do {
            *(double *)(uVar15 + lVar13 * 8) = pdVar5[lVar13] * (1.0 / local_420);
            lVar13 = lVar13 + 1;
          } while (lVar18 != lVar13);
        }
        if (0 < local_300.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow) {
          memset(local_300.fElem,0,local_300.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow << 3);
        }
        *pdVar6 = local_420;
        iVar9 = *m;
        if ((0 < iVar9) && (lVar20 <= *max_iter)) {
          local_3f8 = 4.94065645841247e-324;
          local_420 = 0.0;
          lVar18 = 0;
          local_3b8 = lVar20;
          do {
            (*(A->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x25])
                      (A,v + lVar18,&local_150,0);
            (*(M->super_TPZSolver).super_TPZSavable._vptr_TPZSavable[0xb])
                      (M,&local_150,&local_390,0);
            lVar20 = 0;
            pTVar14 = v;
            do {
              dVar23 = Dot<double>(&local_390,pTVar14);
              lVar13 = (H->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
              if ((lVar13 <= lVar20) ||
                 ((H->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar18)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              pdVar6 = H->fElem;
              *(double *)((long)pdVar6 + lVar20 * 8 + (long)local_420 * lVar13) = dVar23;
              if ((lVar13 <= lVar20) ||
                 ((H->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar18)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              TPZFMatrix<double>::ZAXPY(&local_390,-pdVar6[lVar13 * lVar18 + lVar20],pTVar14);
              lVar20 = lVar20 + 1;
              pTVar14 = pTVar14 + 1;
            } while (local_3f8 != (double)lVar20);
            dVar23 = Dot<double>(&local_390,&local_390);
            if (dVar23 < 0.0) {
              dVar23 = sqrt(dVar23);
            }
            else {
              dVar23 = SQRT(dVar23);
            }
            lVar13 = lVar18 + 1;
            lVar20 = (H->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
            if ((lVar20 <= lVar13) ||
               ((H->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar18)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            H->fElem[lVar20 * lVar18 + lVar13] = dVar23;
            pTVar14 = v + lVar13;
            TPZFMatrix<double>::operator=(pTVar14,&local_390);
            lVar20 = (H->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
            if ((lVar20 <= lVar13) ||
               ((H->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar18)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            (*(pTVar14->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0x26])(1.0 / H->fElem[lVar20 * lVar18 + lVar13],pTVar14);
            lVar20 = (H->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
            if (lVar18 != 0) {
              lVar21 = 0;
              do {
                lVar17 = (H->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
                if (lVar17 <= lVar18 || lVar20 <= lVar21) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                pdVar6 = H->fElem;
                lVar1 = lVar21 + 1;
                if ((lVar20 <= lVar1) || (lVar17 <= lVar18)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                dVar23 = local_1e0.fElem[lVar21];
                dVar2 = *(double *)((long)pdVar6 + lVar21 * 8 + lVar20 * (long)local_420);
                dVar3 = local_270.fElem[lVar21];
                dVar4 = pdVar6[lVar20 * lVar18 + lVar21 + 1];
                pdVar6[lVar20 * lVar18 + lVar21 + 1] = dVar23 * dVar4 - dVar3 * dVar2;
                *(double *)((long)pdVar6 + lVar21 * 8 + lVar20 * (long)local_420) =
                     dVar23 * dVar2 + dVar3 * dVar4;
                lVar21 = lVar1;
              } while (lVar18 != lVar1);
            }
            lVar21 = (H->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
            if (lVar21 <= lVar18 || lVar20 <= lVar18) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((lVar20 <= lVar13) || (lVar21 <= lVar18)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            GeneratePlaneRotation<double>
                      (H->fElem + lVar20 * lVar18 + lVar18,H->fElem + lVar20 * lVar18 + lVar13,
                       local_1e0.fElem + lVar18,local_270.fElem + lVar18);
            lVar20 = (H->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
            lVar21 = (H->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
            if (lVar21 <= lVar18 || lVar20 <= lVar18) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            pdVar6 = H->fElem;
            lVar17 = lVar20 * lVar18;
            if ((lVar20 <= lVar13) || (lVar21 <= lVar18)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            dVar23 = local_1e0.fElem[lVar18];
            dVar2 = local_270.fElem[lVar18];
            dVar3 = pdVar6[lVar17 + lVar13];
            pdVar6[lVar17 + lVar13] = dVar23 * dVar3 - dVar2 * pdVar6[lVar17 + lVar18];
            pdVar6[lVar17 + lVar18] = dVar23 * pdVar6[lVar17 + lVar18] + dVar2 * dVar3;
            dVar23 = local_300.fElem[lVar18] * -local_270.fElem[lVar18] +
                     local_300.fElem[lVar13] * local_1e0.fElem[lVar18];
            local_300.fElem[lVar18] =
                 local_300.fElem[lVar18] * local_1e0.fElem[lVar18] +
                 local_300.fElem[lVar13] * local_270.fElem[lVar18];
            (local_300.fElem + lVar18)[1] = dVar23;
            dVar23 = ABS(dVar23) / dVar22;
            if (dVar23 < *tol) {
              Update<TPZFMatrix<double>,TPZFMatrix<double>>(x,lVar18,H,&local_300,v);
              *tol = dVar23;
              *max_iter = local_3b8;
              uVar15 = *puVar10;
              uVar19 = uVar15 * 0x90 + 8;
              if (uVar15 != 0) {
                lVar20 = uVar15 * 0x90;
                do {
                  TPZFMatrix<double>::~TPZFMatrix
                            ((TPZFMatrix<double> *)((long)puVar10 + lVar20 + -0x88));
                  lVar20 = lVar20 + -0x90;
                } while (lVar20 != 0);
              }
              goto LAB_00c5700a;
            }
            lVar20 = local_3b8 + 1;
            iVar9 = *m;
            if (iVar9 <= lVar13) break;
            local_3f8 = (double)((long)local_3f8 + 1);
            local_420 = (double)((long)local_420 + 8);
            bVar7 = local_3b8 < *max_iter;
            lVar18 = lVar13;
            local_3b8 = lVar20;
          } while (bVar7);
        }
        Update<TPZFMatrix<double>,TPZFMatrix<double>>(x,(long)(iVar9 + -1),H,&local_300,v);
        (*(A->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x27])
                  (0xbff0000000000000,0x3ff0000000000000,A,x,b,A_00,0);
        (*(M->super_TPZSolver).super_TPZSavable._vptr_TPZSavable[0xb])(M,A_00,A_00,0);
        local_420 = Dot<double>(A_00,A_00);
        if (local_420 < 0.0) {
          local_420 = sqrt(local_420);
        }
        else {
          local_420 = SQRT(local_420);
        }
        local_3f8 = local_420 / dVar22;
        if (local_3f8 < *tol) goto LAB_00c5707b;
      } while (lVar20 <= *max_iter);
    }
    *tol = local_3f8;
    uVar15 = *puVar10;
    if (uVar15 != 0) {
      lVar20 = uVar15 * 0x90;
      do {
        TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)((long)puVar10 + lVar20 + -0x88));
        lVar20 = lVar20 + -0x90;
      } while (lVar20 != 0);
    }
    operator_delete__(puVar10,uVar15 * 0x90 + 8);
    iVar9 = 1;
    goto LAB_00c57019;
  }
  *tol = local_3f8;
  TPZFMatrix<double>::operator+=(x,&A_00->super_TPZMatrix<double>);
  *max_iter = 0;
  goto LAB_00c57017;
LAB_00c5707b:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"iter ",5);
  poVar12 = std::ostream::_M_insert<long>((long)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12," - ",3);
  poVar12 = std::ostream::_M_insert<double>(local_3f8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
  std::ostream::put((char)poVar12);
  std::ostream::flush();
  *tol = local_3f8;
  *max_iter = lVar20;
  uVar15 = *puVar10;
  uVar19 = uVar15 * 0x90 + 8;
  if (uVar15 != 0) {
    lVar20 = uVar15 * 0x90;
    do {
      TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)((long)puVar10 + lVar20 + -0x88));
      lVar20 = lVar20 + -0x90;
    } while (lVar20 != 0);
  }
LAB_00c5700a:
  operator_delete__(puVar10,uVar19);
LAB_00c57017:
  iVar9 = 0;
LAB_00c57019:
  TPZFMatrix<double>::~TPZFMatrix(&local_c0);
  TPZFMatrix<double>::~TPZFMatrix(&local_390);
  TPZFMatrix<double>::~TPZFMatrix(&local_150);
  TPZFMatrix<double>::~TPZFMatrix(&local_270);
  TPZFMatrix<double>::~TPZFMatrix(&local_1e0);
  TPZFMatrix<double>::~TPZFMatrix(&local_300);
  return iVar9;
}

Assistant:

int 
GMRES( Operator &A, Vector &x, const Vector &b,
	  Preconditioner &M, Matrix &H, int &m, int64_t &max_iter,
	  Real &tol, Vector *residual,const int FromCurrent)
{
	Real resid;
	int64_t j = 1, k;
	Vector s(m+1), cs(m+1), sn(m+1), w1,w;
	
	//  Real normb = norm(M.Solve(b));
	Vector resbackup;
	Vector *res = residual;
	if(!res) res = &resbackup;
	Vector &r = *res;
    M.Solve(b,r);
	Real normb = TPZExtractVal::val(Norm(r));	//  Vector r = b - A*x;
	if(FromCurrent) 
    {
        A.MultAdd(x,b,r,-1.,1.);
    } 
    else 
    {
		x.Zero();
		r = b;
	}
	M.Solve(r,w);
	r=w;
	Real beta = TPZExtractVal::val(Norm(r));
	
	if (normb == 0.0)
		normb = 1;
	
	if ((resid = ((Real)TPZExtractVal::val(Norm(r))) / normb) <= tol) {
		tol = resid;
		x+=r;
		max_iter = 0;
		return 0;
	}
	
	Vector *v = new Vector[m+1];
	
	while (j <= max_iter) {
        int64_t rows = r.Rows();
        v[0].Resize(rows,1);
        for (int64_t i=0; i<rows; i++) {
            v[0](i) = TPZExtractVal::val(r(i)) * ((Real)(1.0/beta));
        }
        int64_t srows = s.Rows();
        for (int64_t i=0; i<srows; i++) {
            s(i) = REAL(0.);
        }
//		v[0] = r * (REAL(1.0 / beta));    // ??? r / beta
//		s = REAL(0.0);
		s(0) = beta;
		
		for (int64_t i = 0; i < m && j <= max_iter; i++, j++) {
			A.Multiply(v[i],w1);
			M.Solve(w1,w);
			for (k = 0; k <= i; k++) {
				H(k, i) = Dot(w, v[k]);
				w.ZAXPY(-H(k, i), v[k]);
			}
			H(i+1, i) = Norm(w);
			v[i+1] = w;
			v[i+1] *= (1.0)/TPZExtractVal::val(H(i+1,i));
			
			for (k = 0; k < i; k++)
				ApplyPlaneRotation(H(k,i), H(k+1,i), cs(k), sn(k));
			
			GeneratePlaneRotation(H(i,i), H(i+1,i), cs(i), sn(i));
			ApplyPlaneRotation(H(i,i), H(i+1,i), cs(i), sn(i));
			ApplyPlaneRotation(s(i), s(i+1), cs(i), sn(i));
			resid = ((Real)fabs(s(i+1)))/normb;
			if (resid < tol) {
				Update(x, i, H, s, v);
				tol = resid;
				max_iter = j;
				delete [] v;
				return 0;
			}
		}
		Update(x, m - 1, H, s, v);
		A.MultAdd(x,b,r,-1.,1.);
		M.Solve(r,r);
		beta = TPZExtractVal::val(Norm(r));
        resid = beta/normb;
		if (resid < tol) {
            std::cout << "iter " << j << " - " << resid << std::endl;
			tol = resid;
			max_iter = j;
			delete [] v;
			return 0;
		}
	}
	
	tol = resid;
	delete [] v;
	return 1;
}